

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unixmake2.cpp
# Opt level: O3

void __thiscall
UnixMakefileGenerator::writeSubTargets
          (UnixMakefileGenerator *this,QTextStream *t,QList<MakefileGenerator::SubTarget_*> targets,
          int flags)

{
  long lVar1;
  QMakeProject *this_00;
  QList<MakefileGenerator::SubTarget_*> targets_00;
  Data *pDVar2;
  qsizetype qVar3;
  Data *pDVar4;
  char cVar5;
  QTextStream *pQVar6;
  QTextStream *this_01;
  undefined4 in_register_00000014;
  long *plVar7;
  char16_t *pcVar8;
  ulong uVar9;
  long in_FS_OFFSET;
  QByteArrayView QVar10;
  QByteArrayView QVar11;
  undefined8 in_stack_fffffffffffffe08;
  undefined8 in_stack_fffffffffffffe10;
  long *plVar12;
  qsizetype in_stack_fffffffffffffe18;
  QStringBuilder<QString_&,_QString_&> local_1c0;
  QString local_1b0;
  QString local_198;
  QString local_178;
  QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[8],_QString>,_const_char_(&)[28]>,_QString>
  local_158;
  QString local_118;
  QString local_f8;
  QString local_d8;
  ProKey local_b8;
  QString local_88;
  QString local_68;
  QArrayData *local_50;
  long local_48;
  long local_40;
  long local_38;
  
  plVar7 = (long *)CONCAT44(in_register_00000014,flags);
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_50 = (QArrayData *)*plVar7;
  local_48 = plVar7[1];
  local_40 = plVar7[2];
  if (local_50 != (QArrayData *)0x0) {
    LOCK();
    (local_50->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_50->ref_)._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  targets_00.d.ptr = (SubTarget **)in_stack_fffffffffffffe10;
  targets_00.d.d = (Data *)in_stack_fffffffffffffe08;
  targets_00.d.size = in_stack_fffffffffffffe18;
  MakefileGenerator::writeSubTargets(&this->super_MakefileGenerator,t,targets_00,(int)&local_50);
  if (local_50 != (QArrayData *)0x0) {
    LOCK();
    (local_50->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_50->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_50->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_50,8,0x10);
    }
  }
  pQVar6 = (QTextStream *)QTextStream::operator<<(t,"dist: distdir FORCE");
  Qt::endl(pQVar6);
  QTextStream::operator<<
            (t,
             "\t(cd `dirname $(DISTDIR)` && $(TAR) $(DISTNAME).tar $(DISTNAME) && $(COMPRESS) $(DISTNAME).tar) && $(MOVE) `dirname $(DISTDIR)`/$(DISTNAME).tar.gz . && $(DEL_FILE) -r $(DISTDIR)"
            );
  pQVar6 = (QTextStream *)Qt::endl(t);
  Qt::endl(pQVar6);
  QTextStream::operator<<(t,"distdir:");
  if (plVar7[2] != 0) {
    uVar9 = 0;
    do {
      lVar1 = *(long *)(plVar7[1] + uVar9 * 8);
      pQVar6 = (QTextStream *)QTextStream::operator<<(t," ");
      pQVar6 = (QTextStream *)QTextStream::operator<<(pQVar6,(QString *)(lVar1 + 0x60));
      QTextStream::operator<<(pQVar6,"-distdir");
      uVar9 = uVar9 + 1;
    } while (uVar9 < (ulong)plVar7[2]);
  }
  pQVar6 = (QTextStream *)QTextStream::operator<<(t," FORCE\n\t");
  QVar10.m_data = (storage_type *)0xa;
  QVar10.m_size = (qsizetype)&local_158;
  QString::fromUtf8(QVar10);
  local_68.d.d = (Data *)local_158.a.a.a;
  local_68.d.ptr = (char16_t *)local_158.a.a.b.d.d;
  local_68.d.size = (qsizetype)local_158.a.a.b.d.ptr;
  MakefileGenerator::mkdir_p_asstring
            ((QString *)&local_b8,&this->super_MakefileGenerator,&local_68,false);
  pQVar6 = (QTextStream *)QTextStream::operator<<(pQVar6,(QString *)&local_b8);
  pQVar6 = (QTextStream *)QTextStream::operator<<(pQVar6,"\n\t");
  pQVar6 = (QTextStream *)QTextStream::operator<<(pQVar6,"$(COPY_FILE) --parents ");
  ProKey::ProKey((ProKey *)&local_158,"DISTFILES");
  MakefileGenerator::fileVar(&local_88,&this->super_MakefileGenerator,(ProKey *)&local_158);
  pQVar6 = (QTextStream *)QTextStream::operator<<(pQVar6,(QString *)&local_88);
  pQVar6 = (QTextStream *)QTextStream::operator<<(pQVar6," $(DISTDIR)");
  pQVar6 = (QTextStream *)QTextStream::operator<<(pQVar6,(QString *)&Option::dir_sep);
  pQVar6 = (QTextStream *)Qt::endl(pQVar6);
  Qt::endl(pQVar6);
  if (&(local_88.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_88.d.d)->super_QArrayData,2,0x10);
    }
  }
  plVar12 = plVar7;
  if ((QArrayData *)local_158.a.a.a != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)*local_158.a.a.a)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)*local_158.a.a.a)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)*local_158.a.a.a)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_158.a.a.a,2,0x10);
    }
  }
  if (&(local_b8.super_ProString.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_b8.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
    super___atomic_base<int>._M_i =
         ((local_b8.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_b8.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
        super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_b8.super_ProString.m_string.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_68.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_68.d.d)->super_QArrayData,2,0x10);
    }
  }
  local_68.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_68.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_68.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  this_00 = (this->super_MakefileGenerator).project;
  ProKey::ProKey(&local_b8,"QMAKE_ABSOLUTE_SOURCE_PATH");
  QMakeEvaluator::first((ProString *)&local_158,&this_00->super_QMakeEvaluator,&local_b8);
  ProString::toQString(&local_68,(ProString *)&local_158);
  if ((QArrayData *)local_158.a.a.a != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)*local_158.a.a.a)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)*local_158.a.a.a)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)*local_158.a.a.a)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_158.a.a.a,2,0x10);
    }
  }
  if (&(local_b8.super_ProString.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_b8.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
    super___atomic_base<int>._M_i =
         ((local_b8.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_b8.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
        super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_b8.super_ProString.m_string.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (plVar7[2] != 0) {
    uVar9 = 0;
    do {
      lVar1 = *(long *)(plVar7[1] + uVar9 * 8);
      local_b8.super_ProString.m_string.d.d = *(Data **)(lVar1 + 0x18);
      local_b8.super_ProString.m_string.d.ptr = *(char16_t **)(lVar1 + 0x20);
      local_b8.super_ProString.m_string.d.size = *(long *)(lVar1 + 0x28);
      if (&(local_b8.super_ProString.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_b8.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
        super___atomic_base<int>._M_i =
             ((local_b8.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
             super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      plVar7 = plVar12;
      pQVar6 = t;
      if (local_b8.super_ProString.m_string.d.size != 0) {
        cVar5 = QString::endsWith((QString *)&local_b8,0x2e5bf0);
        plVar7 = plVar12;
        pQVar6 = t;
        if (cVar5 == '\0') {
          QString::append((QString *)&local_b8);
          plVar7 = plVar12;
          pQVar6 = t;
        }
      }
      local_88.d.d = *(Data **)(lVar1 + 0x30);
      local_88.d.ptr = *(char16_t **)(lVar1 + 0x38);
      local_88.d.size = *(long *)(lVar1 + 0x40);
      if (&(local_88.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      if (local_88.d.size != 0) {
        cVar5 = QString::endsWith((QString *)&local_88,0x2e5bf0);
        if (cVar5 == '\0') {
          QString::append((QString *)&local_88);
        }
      }
      if ((undefined1 *)local_68.d.size != (undefined1 *)0x0) {
        cVar5 = QString::startsWith((QString *)&local_88,(CaseSensitivity)&local_68);
        if (cVar5 != '\0') {
          QString::mid((longlong)&local_f8,(longlong)&local_88);
          local_158.a.a.b.d.size = local_f8.d.size;
          local_158.a.a.b.d.ptr = local_f8.d.ptr;
          local_158.a.a.b.d.d = local_f8.d.d;
          local_158.a.a.a = (char (*) [8])&Option::output_dir;
          local_f8.d.d = (Data *)0x0;
          local_f8.d.ptr = (char16_t *)0x0;
          local_f8.d.size = 0;
          QStringBuilder<QString_&,_QString>::convertTo<QString>
                    (&local_d8,(QStringBuilder<QString_&,_QString> *)&local_158);
          pcVar8 = local_88.d.ptr;
          pDVar4 = local_88.d.d;
          qVar3 = local_d8.d.size;
          pDVar2 = local_d8.d.d;
          local_d8.d.d = local_88.d.d;
          local_88.d.d = pDVar2;
          local_88.d.ptr = local_d8.d.ptr;
          local_d8.d.ptr = pcVar8;
          local_d8.d.size = local_88.d.size;
          local_88.d.size = qVar3;
          if (&pDVar4->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if ((pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
              QArrayData::deallocate(&pDVar4->super_QArrayData,2,0x10);
            }
          }
          if (&(local_158.a.a.b.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_158.a.a.b.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_158.a.a.b.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                 _M_i + -1;
            UNLOCK();
            if (((local_158.a.a.b.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                _M_i == 0) {
              QArrayData::deallocate(&(local_158.a.a.b.d.d)->super_QArrayData,2,0x10);
            }
          }
          if (&(local_f8.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_f8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_f8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1
            ;
            UNLOCK();
            if (((local_f8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
            {
              QArrayData::deallocate(&(local_f8.d.d)->super_QArrayData,2,0x10);
            }
          }
        }
      }
      local_d8.d.d = local_88.d.d;
      local_d8.d.ptr = local_88.d.ptr;
      local_d8.d.size = local_88.d.size;
      if (&(local_88.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      cVar5 = QString::endsWith((QString *)&local_d8,0x2e5bf0);
      if (cVar5 != '\0') {
        QString::chop((longlong)&local_d8);
      }
      cVar5 = QString::startsWith((QString *)&local_d8,0x2e5bf0);
      if (cVar5 == '\0') {
        pcVar8 = Option::dir_sep.d.ptr;
        if (Option::dir_sep.d.ptr == (char16_t *)0x0) {
          pcVar8 = (char16_t *)&QString::_empty;
        }
        QString::insert((longlong)&local_d8,(QChar *)0x0,(longlong)pcVar8);
      }
      local_f8.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      local_f8.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      local_f8.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
      if (local_88.d.size == 0) {
        QVar11.m_data = (storage_type *)0x2;
        QVar11.m_size = (qsizetype)&local_158;
        QString::fromUtf8(QVar11);
        local_f8.d.d = (Data *)local_158.a.a.a;
        local_f8.d.ptr = (char16_t *)local_158.a.a.b.d.d;
        local_f8.d.size = (qsizetype)local_158.a.a.b.d.ptr;
      }
      else {
        (*(this->super_MakefileGenerator).super_QMakeSourceFileInfo._vptr_QMakeSourceFileInfo[0xc])
                  (&local_118,this,&local_88);
        local_158.a.a.b.d.size = local_118.d.size;
        local_158.a.a.b.d.ptr = local_118.d.ptr;
        local_158.a.a.b.d.d = local_118.d.d;
        local_118.d.size = 0;
        local_158.a.a.a = (char (*) [8])0x2ad47e;
        local_118.d.d = (Data *)0x0;
        local_118.d.ptr = (char16_t *)0x0;
        local_158.a.b = (char (*) [28])0x2ad41c;
        QStringBuilder<QStringBuilder<const_char_(&)[6],_QString>,_const_char_(&)[5]>::
        convertTo<QString>(&local_f8,
                           (QStringBuilder<QStringBuilder<const_char_(&)[6],_QString>,_const_char_(&)[5]>
                            *)&local_158);
        if (&(local_158.a.a.b.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_158.a.a.b.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_158.a.a.b.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
               + -1;
          UNLOCK();
          if (((local_158.a.a.b.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
              == 0) {
            QArrayData::deallocate(&(local_158.a.a.b.d.d)->super_QArrayData,2,0x10);
          }
        }
        if (&(local_118.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_118.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_118.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_118.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
          {
            QArrayData::deallocate(&(local_118.d.d)->super_QArrayData,2,0x10);
          }
        }
      }
      local_118.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      local_118.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      local_118.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
      (*(this->super_MakefileGenerator).super_QMakeSourceFileInfo._vptr_QMakeSourceFileInfo[0xc])
                (&local_178,this,lVar1 + 0x78);
      qVar3 = local_178.d.size;
      pcVar8 = local_178.d.ptr;
      pDVar2 = local_178.d.d;
      local_178.d.size = 0;
      local_178.d.d = (Data *)0x0;
      local_178.d.ptr = (char16_t *)0x0;
      (*(this->super_MakefileGenerator).super_QMakeSourceFileInfo._vptr_QMakeSourceFileInfo[0xc])
                (&local_198,this,&local_d8);
      local_158.b.d.size = local_198.d.size;
      local_158.b.d.ptr = local_198.d.ptr;
      local_158.b.d.d = local_198.d.d;
      local_158.a.a.a = (char (*) [8])0x2ae87b;
      local_158.a.a.b.d.d = pDVar2;
      local_158.a.a.b.d.ptr = pcVar8;
      local_158.a.a.b.d.size = qVar3;
      local_158.a.b = (char (*) [28])0x2ae883;
      local_198.d.d = (Data *)0x0;
      local_198.d.ptr = (char16_t *)0x0;
      local_198.d.size = 0;
      QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[8],_QString>,_const_char_(&)[28]>,_QString>
      ::convertTo<QString>(&local_118,&local_158);
      QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[8],_QString>,_const_char_(&)[28]>,_QString>
      ::~QStringBuilder(&local_158);
      if (&(local_198.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_198.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_198.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_198.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_198.d.d)->super_QArrayData,2,0x10);
        }
      }
      t = pQVar6;
      if (&(local_178.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_178.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_178.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_178.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_178.d.d)->super_QArrayData,2,0x10);
        }
      }
      local_158.a.a.a = *(char (**) [8])(lVar1 + 0x78);
      local_158.a.a.b.d.d = *(Data **)(lVar1 + 0x80);
      local_158.a.a.b.d.ptr = *(char16_t **)(lVar1 + 0x88);
      if ((QArrayData *)local_158.a.a.a != (QArrayData *)0x0) {
        LOCK();
        (((QArrayData *)local_158.a.a.a)->ref_)._q_value.super___atomic_base<int>._M_i =
             (((QArrayData *)local_158.a.a.a)->ref_)._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      local_178.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      local_178.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      local_178.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
      local_1c0.b = (QString *)(lVar1 + 0x48);
      local_1c0.a = (QString *)&local_b8;
      QStringBuilder<QString_&,_QString_&>::convertTo<QString>(&local_1b0,&local_1c0);
      MakefileGenerator::fileFixify
                (&local_198,&this->super_MakefileGenerator,&local_1b0,(FileFixifyTypes)0x4,true);
      (*(this->super_MakefileGenerator).super_QMakeSourceFileInfo._vptr_QMakeSourceFileInfo[0xc])
                (&local_178,this,&local_198);
      if (&(local_198.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_198.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_198.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_198.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_198.d.d)->super_QArrayData,2,0x10);
        }
      }
      if (&(local_1b0.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_1b0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_1b0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_1b0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_1b0.d.d)->super_QArrayData,2,0x10);
        }
      }
      cVar5 = QString::startsWith((QString *)&local_158,(CaseSensitivity)&local_b8);
      plVar12 = plVar7;
      if (cVar5 != '\0') {
        QString::remove((longlong)&local_158,0);
      }
      this_01 = (QTextStream *)QTextStream::operator<<(pQVar6,(QString *)(lVar1 + 0x60));
      QTextStream::operator<<(this_01,"-distdir: FORCE");
      (*(this->super_MakefileGenerator).super_QMakeSourceFileInfo._vptr_QMakeSourceFileInfo[0xc])
                (&local_198,this,&local_158);
      MakefileGenerator::writeSubTargetCall
                (&this->super_MakefileGenerator,pQVar6,(QString *)&local_b8,&local_178,&local_88,
                 &local_198,&local_f8,&local_118);
      if (&(local_198.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_198.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_198.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_198.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_198.d.d)->super_QArrayData,2,0x10);
        }
      }
      Qt::endl(pQVar6);
      if (&(local_178.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_178.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_178.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_178.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_178.d.d)->super_QArrayData,2,0x10);
        }
      }
      if ((QArrayData *)local_158.a.a.a != (QArrayData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)*local_158.a.a.a)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)*local_158.a.a.a)->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)*local_158.a.a.a)->_q_value).super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate((QArrayData *)local_158.a.a.a,2,0x10);
        }
      }
      if (&(local_118.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_118.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_118.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_118.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_118.d.d)->super_QArrayData,2,0x10);
        }
      }
      if (&(local_f8.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_f8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_f8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_f8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_f8.d.d)->super_QArrayData,2,0x10);
        }
      }
      if (&(local_d8.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_d8.d.d)->super_QArrayData,2,0x10);
        }
      }
      if (&(local_88.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_88.d.d)->super_QArrayData,2,0x10);
        }
      }
      if (&(local_b8.super_ProString.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_b8.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
        super___atomic_base<int>._M_i =
             ((local_b8.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
             super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_b8.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
            super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_b8.super_ProString.m_string.d.d)->super_QArrayData,2,0x10);
        }
      }
      uVar9 = uVar9 + 1;
    } while (uVar9 < (ulong)plVar7[2]);
  }
  if (&(local_68.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_68.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void
UnixMakefileGenerator::writeSubTargets(QTextStream &t, QList<MakefileGenerator::SubTarget*> targets, int flags)
{
    MakefileGenerator::writeSubTargets(t, targets, flags);

    t << "dist: distdir FORCE" << Qt::endl;
    t << "\t(cd `dirname $(DISTDIR)` && $(TAR) $(DISTNAME).tar $(DISTNAME) && $(COMPRESS) $(DISTNAME).tar)"
         " && $(MOVE) `dirname $(DISTDIR)`/$(DISTNAME).tar.gz . && $(DEL_FILE) -r $(DISTDIR)";
    t << Qt::endl << Qt::endl;

    t << "distdir:";
    for (int target = 0; target < targets.size(); ++target) {
        SubTarget *subtarget = targets.at(target);
        t << " " << subtarget->target << "-distdir";
    }
    t << " FORCE\n\t"
      << mkdir_p_asstring("$(DISTDIR)", false) << "\n\t"
      << "$(COPY_FILE) --parents " << fileVar("DISTFILES") << " $(DISTDIR)" << Option::dir_sep << Qt::endl << Qt::endl;

    const QString abs_source_path = project->first("QMAKE_ABSOLUTE_SOURCE_PATH").toQString();
    for (int target = 0; target < targets.size(); ++target) {
        SubTarget *subtarget = targets.at(target);
        QString in_directory = subtarget->in_directory;
        if (!in_directory.isEmpty() && !in_directory.endsWith(Option::dir_sep))
            in_directory += Option::dir_sep;
        QString out_directory = subtarget->out_directory;
        if (!out_directory.isEmpty() && !out_directory.endsWith(Option::dir_sep))
            out_directory += Option::dir_sep;
        if (!abs_source_path.isEmpty() && out_directory.startsWith(abs_source_path))
            out_directory = Option::output_dir + out_directory.mid(abs_source_path.size());

        QString dist_directory = out_directory;
        if (dist_directory.endsWith(Option::dir_sep))
            dist_directory.chop(Option::dir_sep.size());
        if (!dist_directory.startsWith(Option::dir_sep))
            dist_directory.prepend(Option::dir_sep);

        QString out_directory_cdin = out_directory.isEmpty() ? QString("\n\t")
                                                             : "\n\tcd " + escapeFilePath(out_directory) + " && ";
        QString makefilein = " -e -f " + escapeFilePath(subtarget->makefile)
                + " distdir DISTDIR=$(DISTDIR)" + escapeFilePath(dist_directory);

        QString out = subtarget->makefile;
        QString in = escapeFilePath(fileFixify(in_directory + subtarget->profile, FileFixifyAbsolute));
        if (out.startsWith(in_directory))
            out.remove(0, in_directory.size());

        t << subtarget->target << "-distdir: FORCE";
        writeSubTargetCall(t, in_directory, in, out_directory, escapeFilePath(out),
                           out_directory_cdin, makefilein);
        t << Qt::endl;
    }
}